

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

InternalParseResult * __thiscall
Catch::clara::detail::ExeName::parse
          (InternalParseResult *__return_storage_ptr__,ExeName *this,string *param_1,
          TokenStream *tokens)

{
  ParseState local_38;
  
  local_38.m_type = NoMatch;
  TokenStream::TokenStream(&local_38.m_remainingTokens,tokens);
  BasicResult<Catch::clara::detail::ParseState>::ok<Catch::clara::detail::ParseState>
            (__return_storage_ptr__,&local_38);
  std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::~vector
            (&local_38.m_remainingTokens.m_tokenBuffer);
  return __return_storage_ptr__;
}

Assistant:

auto parse( std::string const&, TokenStream const &tokens ) const -> InternalParseResult override {
            return InternalParseResult::ok( ParseState( ParseResultType::NoMatch, tokens ) );
        }